

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

const_iterator __thiscall
ghc::filesystem::path::iterator::decrement(iterator *this,const_iterator *pos)

{
  char *pcVar1;
  char *local_28;
  char *local_20;
  char *local_18;
  
  pcVar1 = pos->_M_current;
  local_20 = (this->_first)._M_current;
  local_18 = pcVar1;
  if (((local_20 != pcVar1) && (local_18 = pcVar1 + -1, local_18 != (this->_root)._M_current)) &&
     (((this->_last)._M_current != pcVar1 || (*local_18 != '/')))) {
    std::
    __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
              (&local_28);
    pcVar1 = (this->_first)._M_current;
    local_18 = local_28;
    if (((long)local_28 - (long)pcVar1 == 2) && (*pcVar1 == '/')) {
      local_18 = local_28 + (ulong)(pcVar1[1] != '/') * 2 + -2;
    }
  }
  return (const_iterator)local_18;
}

Assistant:

GHC_INLINE path::impl_string_type::const_iterator path::iterator::decrement(const path::impl_string_type::const_iterator& pos) const
{
    path::impl_string_type::const_iterator i = pos;
    if (i != _first) {
        --i;
        // if this is now the root slash or the trailing slash, we are done,
        // else check for network name
        if (i != _root && (pos != _last || *i != '/')) {
#ifdef GHC_OS_WINDOWS
            static const std::string seps = "/:";
            i = std::find_first_of(std::reverse_iterator<path::impl_string_type::const_iterator>(i), std::reverse_iterator<path::impl_string_type::const_iterator>(_first), seps.begin(), seps.end()).base();
            if (i > _first && *i == ':') {
                i++;
            }
#else
            i = std::find(std::reverse_iterator<path::impl_string_type::const_iterator>(i), std::reverse_iterator<path::impl_string_type::const_iterator>(_first), '/').base();
#endif
            // Now we have to check if this is a network name
            if (i - _first == 2 && *_first == '/' && *(_first + 1) == '/') {
                i -= 2;
            }
        }
    }
    return i;
}